

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba.h
# Opt level: O0

void ClownLZSS::Internal::Gba::Decompress<std::ifstream,std::ofstream&>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char>_&> *output,uint uncompressed_size)

{
  bool bVar1;
  uchar value;
  byte bVar2;
  byte bVar3;
  difference_type dVar4;
  uint distance;
  uint count;
  uint b1;
  uint b0;
  BitField<decltype(input)> descriptor_bits;
  pos_type output_start_position;
  uint uncompressed_size_local;
  DecompressorOutput<std::basic_ofstream<char>_&> *output_local;
  DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input_local;
  
  join_0x00000010_0x00000000_ =
       OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>_>
       ::Tell(&output->
               super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>_>
             );
  BitField::
  Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
  ::Reader((Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
            *)&b1,input);
  while (dVar4 = OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>_>
                 ::Distance(&output->
                             super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>_&,_ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>_>
                            ,(pos_type *)&descriptor_bits.bits_remaining),
        dVar4 < (long)(ulong)uncompressed_size) {
    bVar1 = BitField::
            Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
            ::Pop((Reader<1U,_(ClownLZSS::Internal::BitField::ReadWhen)0,_(ClownLZSS::Internal::BitField::PopWhere)1,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_&>
                   *)&b1);
    if (bVar1) {
      bVar2 = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      *)input);
      bVar3 = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      *)input);
      DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>::Copy
                (output,((bVar2 & 0xf) << 8 | (uint)bVar3) + 1,(bVar2 >> 4) + 3);
    }
    else {
      value = InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              ::Read((InputCommon<ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                      *)input);
      OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>_>
      ::Write((OutputCommonBase<ClownLZSS::DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,__1>_>
               *)output,value);
    }
  }
  return;
}

Assistant:

void Decompress(DecompressorInput<T1> &input, DecompressorOutput<T2> &output, unsigned int uncompressed_size)
			{
				const auto output_start_position = output.Tell();

				BitField<decltype(input)> descriptor_bits(input);

				while (output.Distance(output_start_position) < uncompressed_size)
				{
					if (!descriptor_bits.Pop())
					{
						// Literal
						output.Write(input.Read());
					}
					else
					{
						// Match
						const unsigned int b0 = input.Read();
						const unsigned int b1 = input.Read();
						const unsigned int count = ((b0 >> 4) & 0xf) + Decompressor::minimum_match_length;
						const unsigned int distance = (((b0 & 0xfu) << 8) | b1) + Decompressor::minimum_match_distance;
						output.Copy(distance, count);
					}
				}
			}